

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O2

void setInitialStateFromUnicodeKR(UConverter *converter,UConverterDataISO2022 *myConverterData)

{
  UConverter *pUVar1;
  
  if (converter->charErrorBufferLength == '\0') {
    converter->charErrorBufferLength = '\x04';
    builtin_memcpy(converter->charErrorBuffer,"\x1b$)C",4);
  }
  if (myConverterData->version == 1) {
    pUVar1 = myConverterData->currentConverter;
    pUVar1->fromUnicodeStatus = 1;
    pUVar1->fromUChar32 = 0;
  }
  return;
}

Assistant:

static inline void
setInitialStateFromUnicodeKR(UConverter* converter,UConverterDataISO2022 *myConverterData){
   /* in ISO-2022-KR the designator sequence appears only once
    * in a file so we append it only once
    */
    if( converter->charErrorBufferLength==0){

        converter->charErrorBufferLength = 4;
        converter->charErrorBuffer[0] = 0x1b;
        converter->charErrorBuffer[1] = 0x24;
        converter->charErrorBuffer[2] = 0x29;
        converter->charErrorBuffer[3] = 0x43;
    }
    if(myConverterData->version == 1) {
        UConverter *cnv = myConverterData->currentConverter;

        cnv->fromUChar32=0;
        cnv->fromUnicodeStatus=1;   /* prevLength */
    }
}